

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

bool llama_state_load_file
               (llama_context *ctx,char *path_session,llama_token *tokens_out,
               size_t n_token_capacity,size_t *n_token_count_out)

{
  bool bVar1;
  exception *err;
  size_t in_stack_00000050;
  llama_token *in_stack_00000058;
  char *in_stack_00000060;
  llama_context *in_stack_00000068;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  llama_context::synchronize
            ((llama_context *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  bVar1 = llama_context::state_load_file
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                     (size_t *)ctx);
  return bVar1;
}

Assistant:

bool llama_state_load_file(llama_context * ctx, const char * path_session, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    ctx->synchronize();

    try {
        return ctx->state_load_file(path_session, tokens_out, n_token_capacity, n_token_count_out);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error loading session file: %s\n", __func__, err.what());
        return false;
    }
}